

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

Snapshot * __thiscall
cmState::CreatePolicyScopeSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot)

{
  pointer pcVar1;
  PositionType PVar2;
  PositionType it;
  ReferenceType __src;
  PointerType pSVar3;
  PointerType pBVar4;
  PointerType pSVar5;
  iterator local_128;
  undefined1 local_118 [168];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  size_type sStack_48;
  size_type local_40;
  size_type sStack_38;
  
  it = originSnapshot.Position;
  __src = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  memcpy(local_118,__src,0xa8);
  pcVar1 = (__src->EntryPointCommand)._M_dataplus._M_p;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (__src->EntryPointCommand)._M_string_length);
  local_50 = __src->EntryPointLine;
  sStack_48 = __src->IncludeDirectoryPosition;
  local_40 = __src->CompileDefinitionsPosition;
  sStack_38 = __src->CompileOptionsPosition;
  local_128 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,it,(SnapshotDataType *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  pSVar3->SnapshotType = PolicyScopeType;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  pSVar3->Keep = false;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  (pBVar4->DirectoryEnd).Tree = local_128.Tree;
  (pBVar4->DirectoryEnd).Position = local_128.Position;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_128);
  PVar2 = (pSVar3->Policies).Position;
  (pSVar5->PolicyScope).Tree = (pSVar3->Policies).Tree;
  (pSVar5->PolicyScope).Position = PVar2;
  __return_storage_ptr__->State = this;
  (__return_storage_ptr__->Position).Tree = local_128.Tree;
  (__return_storage_ptr__->Position).Position = local_128.Position;
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot
cmState::CreatePolicyScopeSnapshot(cmState::Snapshot originSnapshot)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->SnapshotType = PolicyScopeType;
  pos->Keep = false;
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmState::Snapshot(this, pos);
}